

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

void rtr_bgpsec_append_sec_path_seg(rtr_bgpsec *bgpsec,rtr_secure_path_seg *new_seg)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_secure_path_seg *local_28;
  rtr_secure_path_seg *last;
  rtr_secure_path_seg *new_seg_local;
  rtr_bgpsec *bgpsec_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = bgpsec->path;
  if (bgpsec->path == (rtr_secure_path_seg *)0x0) {
    bgpsec->path = new_seg;
  }
  else {
    for (; local_28->next != (rtr_secure_path_seg *)0x0; local_28 = local_28->next) {
    }
    local_28->next = new_seg;
  }
  bgpsec->path_len = bgpsec->path_len + '\x01';
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void rtr_bgpsec_append_sec_path_seg(struct rtr_bgpsec *bgpsec, struct rtr_secure_path_seg *new_seg)
{
	struct rtr_secure_path_seg *last = bgpsec->path;

	if (bgpsec->path) {
		while (last->next)
			last = last->next;
		last->next = new_seg;
	} else {
		bgpsec->path = new_seg;
	}

	bgpsec->path_len++;
}